

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_set_condexec(DisasContext_conflict1 *s)

{
  int iVar1;
  int iVar2;
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 tmp;
  uint32_t val;
  TCGContext_conflict1 *tcg_ctx;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (s->condexec_mask != 0) {
    iVar1 = s->condexec_cond;
    iVar2 = s->condexec_mask;
    ret = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_movi_i32(tcg_ctx_00,ret,iVar1 << 4 | iVar2 >> 1);
    store_cpu_offset(tcg_ctx_00,ret,0x224);
  }
  return;
}

Assistant:

static inline void gen_set_condexec(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (s->condexec_mask) {
        uint32_t val = (s->condexec_cond << 4) | (s->condexec_mask >> 1);
        TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_movi_i32(tcg_ctx, tmp, val);
        store_cpu_field(tcg_ctx, tmp, condexec_bits);
    }
}